

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourceCacheVk::InitializeResources
          (ShaderResourceCacheVk *this,Uint32 Set,Uint32 Offset,Uint32 ArraySize,DescriptorType Type
          ,bool HasImmutableSampler)

{
  ulong *puVar1;
  DescriptorSet *this_00;
  Resource *this_01;
  ulong uVar2;
  difference_type __n;
  ulong uVar3;
  
  this_00 = GetDescriptorSet(this,Set);
  if (ArraySize != 0) {
    uVar3 = (ulong)Offset;
    uVar2 = (ulong)ArraySize;
    do {
      this_01 = DescriptorSet::GetResource(this_00,(Uint32)uVar3);
      Resource::Resource(this_01,Type,HasImmutableSampler);
      puVar1 = (ulong *)(*(long *)&(this->m_DbgInitializedResources).
                                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[Set].
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data + (uVar3 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void ShaderResourceCacheVk::InitializeResources(Uint32 Set, Uint32 Offset, Uint32 ArraySize, DescriptorType Type, bool HasImmutableSampler)
{
    DescriptorSet& DescrSet = GetDescriptorSet(Set);
    for (Uint32 res = 0; res < ArraySize; ++res)
    {
        new (&DescrSet.GetResource(Offset + res)) Resource{Type, HasImmutableSampler};
#ifdef DILIGENT_DEBUG
        m_DbgInitializedResources[Set][size_t{Offset} + res] = true;
#endif
    }
}